

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-type.c
# Opt level: O0

coda_mem_array * coda_mem_array_new(coda_type_array *definition,coda_dynamic_type *attributes)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  coda_expression *pcVar5;
  long local_30;
  long i;
  coda_mem_array *type;
  coda_dynamic_type *attributes_local;
  coda_type_array *definition_local;
  
  if (definition == (coda_type_array *)0x0) {
    coda_set_error(-100,"definition argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                   ,0x24b);
    definition_local = (coda_type_array *)0x0;
  }
  else {
    definition_local = (coda_type_array *)malloc(0x30);
    if (definition_local == (coda_type_array *)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x30,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                     ,0x252);
      definition_local = (coda_type_array *)0x0;
    }
    else {
      definition_local->format = coda_backend_memory;
      *(coda_type_array **)&definition_local->type_class = definition;
      definition->retain_count = definition->retain_count + 1;
      *(mem_type_tag *)&definition_local->name = tag_mem_array;
      definition_local->description = (char *)attributes;
      definition_local->bit_size = 0;
      definition_local->size_expr = (coda_expression *)0x0;
      if ((attributes == (coda_dynamic_type *)0x0) &&
         (iVar4 = create_attributes_record((coda_mem_type *)definition_local), iVar4 != 0)) {
        coda_mem_type_delete((coda_dynamic_type *)definition_local);
        definition_local = (coda_type_array *)0x0;
      }
      else {
        lVar1._0_4_ = (*(coda_type **)&definition_local->type_class)[1].type_class;
        lVar1._4_4_ = (*(coda_type **)&definition_local->type_class)[1].read_type;
        if (0 < lVar1) {
          lVar2._0_4_ = (*(coda_type **)&definition_local->type_class)[1].type_class;
          lVar2._4_4_ = (*(coda_type **)&definition_local->type_class)[1].read_type;
          pcVar5 = (coda_expression *)malloc(lVar2 << 3);
          definition_local->size_expr = pcVar5;
          if (definition_local->size_expr == (coda_expression *)0x0) {
            lVar3._0_4_ = (*(coda_type **)&definition_local->type_class)[1].type_class;
            lVar3._4_4_ = (*(coda_type **)&definition_local->type_class)[1].read_type;
            coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",lVar3 << 3,
                           "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                           ,0x26d);
            coda_mem_type_delete((coda_dynamic_type *)definition_local);
            definition_local = (coda_type_array *)0x0;
          }
          else {
            definition_local->bit_size =
                 *(int64_t *)&(*(coda_type **)&definition_local->type_class)[1].type_class;
            for (local_30 = 0; local_30 < definition_local->bit_size; local_30 = local_30 + 1) {
              *(undefined8 *)(&definition_local->size_expr->tag + local_30 * 2) = 0;
            }
          }
        }
      }
    }
  }
  return (coda_mem_array *)definition_local;
}

Assistant:

coda_mem_array *coda_mem_array_new(coda_type_array *definition, coda_dynamic_type *attributes)
{
    coda_mem_array *type;

    if (definition == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "definition argument is NULL (%s:%u)", __FILE__, __LINE__);
        return NULL;
    }
    type = (coda_mem_array *)malloc(sizeof(coda_mem_array));
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_mem_array), __FILE__, __LINE__);
        return NULL;
    }
    type->backend = coda_backend_memory;
    type->definition = definition;
    definition->retain_count++;
    type->tag = tag_mem_array;
    type->attributes = attributes;
    type->num_elements = 0;
    type->element = NULL;

    if (attributes == NULL)
    {
        if (create_attributes_record((coda_mem_type *)type) != 0)
        {
            coda_mem_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
    }
    if (type->definition->num_elements > 0)
    {
        long i;

        type->element = malloc(type->definition->num_elements * sizeof(coda_dynamic_type *));
        if (type->element == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           type->definition->num_elements * sizeof(coda_dynamic_type *), __FILE__, __LINE__);
            coda_mem_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
        type->num_elements = type->definition->num_elements;
        for (i = 0; i < type->num_elements; i++)
        {
            type->element[i] = NULL;
        }
    }

    return type;
}